

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall
ConfidentialTxIn_EstimateTxInSize_Test::~ConfidentialTxIn_EstimateTxInSize_Test
          (ConfidentialTxIn_EstimateTxInSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInSize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::string scriptsig_template = "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 176, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 222, 146, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 153, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 208, 167, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 301, 260, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 191, 150, exp_script, 0, Script(), false, false, false, scriptsig_template, 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 860, 819, Script(), 226, Script(), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 235, 112, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 8499, 8328, Script(), 0, Script(), true, true, false,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 8627, 8456, Script(), 0, Script(), true, true, false,
        "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, 4391, 4220, Script(), 0, Script(), true, true, true,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 4455, 4284, Script(), 0, Script(), true, true, true,
        "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    uint32_t cache_size = 0;
    EXPECT_NO_THROW((size = ConfidentialTxIn::EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        &wit_size, nullptr, test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, &cache_size,
        test_data.txoutproof_size)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
    if (test_data.minimum_bits == 36) {
      // EXPECT_EQ(cache_size, 2892);
      EXPECT_EQ(cache_size, 4109);
    } else if (test_data.minimum_bits == 52) {
      EXPECT_EQ(cache_size, 4173);
    }
  }
}